

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidgetPrivate::_q_yearEditingFinished(QCalendarWidgetPrivate *this)

{
  QWidget *this_00;
  QCalToolButton *this_01;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QLocale local_48;
  QDate local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QWidget::hide((QWidget *)this->yearEdit);
  QWidget::setFocusPolicy(this_00,this->oldFocusPolicy);
  QObject::removeEventFilter(QCoreApplication::self);
  QSpacerItem::changeSize(this->spaceHolder,0,0,Minimum,Minimum);
  QWidget::show((QWidget *)this->yearButton);
  local_40 = getCurrentDate(this);
  QWidget::locale(&local_48,this_00);
  QAbstractSpinBox::text((QString *)&local_60,(QAbstractSpinBox *)this->yearEdit);
  iVar1 = QLocale::toInt(&local_48,(QString *)&local_60,(bool *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QLocale::~QLocale(&local_48);
  iVar2 = QDate::year(&local_40,*(undefined8 *)&this->m_model->m_calendar);
  local_40.jd = QDate::addYears(&local_40,iVar1 - iVar2,*(undefined8 *)&this->m_model->m_calendar);
  this_01 = this->yearButton;
  QWidget::locale(&local_48,this_00);
  QLocale::toString(&local_60,&local_48,local_40.jd,4,L"yyyy",
                    *(undefined8 *)&this->m_model->m_calendar);
  QAbstractButton::setText((QAbstractButton *)this_01,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QLocale::~QLocale(&local_48);
  updateCurrentPage(this,local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_yearEditingFinished()
{
    Q_Q(QCalendarWidget);
    yearEdit->hide();
    q->setFocusPolicy(oldFocusPolicy);
    qApp->removeEventFilter(q);
    spaceHolder->changeSize(0, 0);
    yearButton->show();
    QDate currentDate = getCurrentDate();
    int newYear = q->locale().toInt(yearEdit->text());
    currentDate = currentDate.addYears(newYear - currentDate.year(m_model->m_calendar), m_model->m_calendar);
    yearButton->setText(q->locale().toString(currentDate, u"yyyy", m_model->m_calendar));
    updateCurrentPage(currentDate);
}